

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O2

void __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::SmallHeapBlockT
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this,HeapBucket *bucket,
          ushort objectSize,ushort objectCount,HeapBlockType heapBlockType)

{
  uint uVar1;
  undefined6 in_register_00000012;
  ulong sizeCat;
  ValidPointers<SmallAllocationBlockAttributes> VVar2;
  
  sizeCat = CONCAT62(in_register_00000012,objectSize) & 0xffffffff;
  HeapBlock::HeapBlock(&this->super_HeapBlock,heapBlockType);
  (this->super_HeapBlock)._vptr_HeapBlock = (_func_int **)&PTR_WBSetBit_01375df8;
  uVar1 = HeapInfo::GetBucketIndex(sizeCat);
  VVar2 = HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetValidPointersForIndex
                    (&HeapInfo::smallAllocValidPointersMap,uVar1);
  this->validPointers = VVar2;
  uVar1 = HeapInfo::GetBucketIndex(sizeCat);
  this->bucketIndex = uVar1;
  this->objectSize = (ushort)sizeCat;
  this->objectCount = objectCount;
  memset(&this->freeBits,0,0xa0);
  ConstructorCommon(this,bucket,objectSize,objectCount,heapBlockType);
  return;
}

Assistant:

SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockT(HeapBucket * bucket, ushort objectSize, ushort objectCount, HeapBlockType heapBlockType)
    : HeapBlock(heapBlockType),
    bucketIndex(HeapInfo::GetBucketIndex(objectSize)),
    validPointers(HeapInfo::smallAllocValidPointersMap.GetValidPointersForIndex(HeapInfo::GetBucketIndex(objectSize))),
    objectSize(objectSize), objectCount(objectCount)
{
    ConstructorCommon(bucket, objectSize, objectCount, heapBlockType);
}